

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzP.cpp
# Opt level: O2

ChNodeFEAxyzP * __thiscall
chrono::fea::ChNodeFEAxyzP::operator=(ChNodeFEAxyzP *this,ChNodeFEAxyzP *other)

{
  double dVar1;
  
  if (other != this) {
    ChNodeFEAbase::operator=(&this->super_ChNodeFEAbase,&other->super_ChNodeFEAbase);
    (this->pos).m_data[0] = (other->pos).m_data[0];
    (this->pos).m_data[1] = (other->pos).m_data[1];
    (this->pos).m_data[2] = (other->pos).m_data[2];
    dVar1 = other->P_dt;
    this->P = other->P;
    this->P_dt = dVar1;
    this->F = other->F;
    ChVariablesGeneric::operator=
              ((ChVariablesGeneric *)&(this->super_ChNodeFEAbase).field_0x18,
               (ChVariablesGeneric *)&(other->super_ChNodeFEAbase).field_0x18);
  }
  return this;
}

Assistant:

ChNodeFEAxyzP& ChNodeFEAxyzP::operator=(const ChNodeFEAxyzP& other) {
    if (&other == this)
        return *this;

    ChNodeFEAbase::operator=(other);

    pos = other.pos;
    P = other.P;
    P_dt = other.P_dt;
    F = other.F;
    variables = other.variables;
    return *this;
}